

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::
write_significand<char,fmt::v11::basic_appender<char>,unsigned_int,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,uint significand,int significand_size,int exponent,
          digit_grouping<char> *grouping)

{
  basic_string_view<char> digits;
  basic_appender<char> bVar1;
  memory_buffer buffer;
  char local_239;
  char local_238;
  undefined7 uStack_237;
  size_t sStack_230;
  undefined8 local_228;
  code *local_220;
  undefined1 local_218 [504];
  
  if ((grouping->thousands_sep_)._M_string_length == 0) {
    bVar1 = format_decimal<char,_unsigned_int,_fmt::v11::basic_appender<char>,_0>
                      (out,significand,significand_size);
    local_238 = '0';
    bVar1 = fill_n<fmt::v11::basic_appender<char>,int,char>(bVar1,exponent,&local_238);
  }
  else {
    sStack_230 = 0;
    local_220 = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
    local_238 = (char)local_218;
    uStack_237 = (undefined7)((ulong)local_218 >> 8);
    local_228 = 500;
    format_decimal<char,_unsigned_int,_fmt::v11::basic_appender<char>,_0>
              ((buffer<char> *)&local_238,significand,significand_size);
    local_239 = '0';
    fill_n<fmt::v11::basic_appender<char>,int,char>((buffer<char> *)&local_238,exponent,&local_239);
    digits.data_._1_7_ = uStack_237;
    digits.data_._0_1_ = local_238;
    digits.size_ = sStack_230;
    bVar1 = digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>(grouping,out,digits);
    if ((undefined1 *)CONCAT71(uStack_237,local_238) != local_218) {
      free((undefined1 *)CONCAT71(uStack_237,local_238));
    }
  }
  return (basic_appender<char>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}